

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeType.cpp
# Opt level: O0

int sjtu::timeType::dateminus(timeType *lhs,timeType *rhs)

{
  int i_1;
  int i;
  int tmp2;
  int tmp1;
  timeType *rhs_local;
  timeType *lhs_local;
  
  tmp1 = 0;
  tmp2 = 0;
  for (i = 1; i < lhs->month; i = i + 1) {
    tmp1 = *(int *)(months + (long)i * 4) + tmp1;
  }
  for (i_1 = 1; i_1 < rhs->month; i_1 = i_1 + 1) {
    tmp2 = *(int *)(months + (long)i_1 * 4) + tmp2;
  }
  return (lhs->day + tmp1) - (rhs->day + tmp2);
}

Assistant:

int timeType::dateminus(const timeType &lhs, const timeType &rhs) {
            int tmp1 = 0, tmp2 = 0;
            for (int i = 1; i < lhs.month; ++i)
                tmp1 += lhs.months[i];
            tmp1 += lhs.day;
            for (int i = 1; i < rhs.month; ++i)
                tmp2 += rhs.months[i];
            tmp2 += rhs.day;
            return (tmp1 - tmp2);
        }